

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

shared_ptr<Promise> createLoopedDelay(void)

{
  Promise *this;
  _func_int **pp_Var1;
  long lVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<Promise> *child;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  shared_ptr<Promise> *p;
  Promise *in_RDI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *next;
  shared_ptr<Promise> sVar6;
  shared_ptr<Promise> promise;
  value_type local_98;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  Promise *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  Promise *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  int local_44;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  createLoopedDelay::max = createLoopedDelay::max + -1;
  if (createLoopedDelay::max == 0) {
    puts("DONE LOOP");
    Promise::New();
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDI->_vptr_Promise;
    _Var5._M_pi[5]._M_weak_count = 1;
    pp_Var1 = _Var5._M_pi[6]._vptr__Sp_counted_base;
    if (pp_Var1 != (_func_int **)0x0) {
      p_Var4 = _Var5._M_pi + 8;
      _Var5._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&_Var5._M_pi[8]._M_use_count;
      for (p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4->_vptr__Sp_counted_base;
          p_Var4 != _Var5._M_pi; p_Var4 = p_Var4 + 1) {
        p_Var4->_vptr__Sp_counted_base[0xd] = (_func_int *)pp_Var1;
      }
    }
    goto LAB_00103202;
  }
  if (timestamp()::prev == '\0') {
    createLoopedDelay();
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar3 = lVar2 - timestamp()::prev;
  timestamp()::prev = lVar2;
  printf("%lli: ",lVar3 / 1000000);
  puts("Creating Looped Delay");
  local_44 = 2000;
  std::__shared_ptr<Delay,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::allocator<Delay>,int>
            ((__shared_ptr<Delay,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (allocator<Delay> *)&local_88,&local_44);
  this_00._M_pi = p_Stack_38;
  next = local_40;
  local_98.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  local_98.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_38;
  local_40 = (element_type *)0x0;
  p_Stack_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (next->is_registered == false) {
    std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::push_back
              (&Promise::entries,&local_98);
    (local_98.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->is_registered = true;
    this_00._M_pi =
         local_98.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    next = local_98.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  local_98.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_98.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = (Promise *)0x0;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xb0);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00108bf0;
  this = (Promise *)(p_Var4 + 1);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(std::shared_ptr<Promise>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Badrpas[P]es-promise-cpp/test.cpp:15:14)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(std::shared_ptr<Promise>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Badrpas[P]es-promise-cpp/test.cpp:15:14)>
             ::_M_manager;
  Promise::Promise(this,(ManuallyResolvedHandler *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  local_68 = this;
  local_60._M_pi = p_Var4;
  if ((p_Var4[2]._vptr__Sp_counted_base == (_func_int **)0x0) ||
     (*(int *)(p_Var4[2]._vptr__Sp_counted_base + 1) == 0)) {
    *(Promise **)&p_Var4[1]._M_use_count = this;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 2),&local_60);
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001030f0;
  }
  else {
LAB_001030f0:
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
  }
  local_58 = local_68;
  local_88._8_8_ = local_60._M_pi;
  if (local_68->is_registered == false) {
    local_88._M_unused._0_8_ = (undefined8)local_68;
    std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::push_back
              (&Promise::entries,(value_type *)&local_88);
    local_88._M_unused._M_function_pointer[0x9c] = (_func_void)0x1;
    local_58 = (Promise *)local_88._M_unused._0_8_;
  }
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  sVar6 = Promise::Then(in_RDI,(shared_ptr<Promise> *)next);
  _Var5 = sVar6.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    _Var5._M_pi = extraout_RDX;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    _Var5._M_pi = extraout_RDX_00;
  }
  if (local_98.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var5._M_pi = extraout_RDX_01;
  }
  if (p_Stack_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_38);
    _Var5._M_pi = extraout_RDX_02;
  }
LAB_00103202:
  sVar6.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Promise>)sVar6.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PromisePtr createLoopedDelay() {
  static int max = 5;
  if (!--max) {
    printf("DONE LOOP\n");
    auto p = Promise::New();
    p->Resolve();
    return p;
  }

  timestamp(); printf("Creating Looped Delay\n");
  return Promise::Register(std::make_shared<Delay>(2000))
      ->Then([](const std::shared_ptr<Promise>& p) {
        timestamp(); printf("Delay Resolved LOOPED\n");
        p->Resolve(createLoopedDelay());
      });
}